

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

void duckdb::DatePart::StructOperator::Operation<duckdb::interval_t>
               (bigint_vec *bigint_values,double_vec *double_values,interval_t *input,idx_t idx,
               part_mask_t mask)

{
  long lVar1;
  long *plVar2;
  double *pdVar3;
  uint uVar4;
  ulong uVar5;
  int64_t extraout_RDX;
  double dVar6;
  interval_t input_00;
  _Vector_base<double_*,_std::allocator<double_*>_> local_168;
  _Vector_base<long_*,_std::allocator<long_*>_> local_150;
  _Vector_base<long_*,_std::allocator<long_*>_> local_138;
  _Vector_base<long_*,_std::allocator<long_*>_> local_120;
  _Vector_base<long_*,_std::allocator<long_*>_> local_108;
  _Vector_base<long_*,_std::allocator<long_*>_> local_f0;
  _Vector_base<long_*,_std::allocator<long_*>_> local_d8;
  _Vector_base<long_*,_std::allocator<long_*>_> local_c0;
  _Vector_base<long_*,_std::allocator<long_*>_> local_a8;
  _Vector_base<long_*,_std::allocator<long_*>_> local_90;
  _Vector_base<long_*,_std::allocator<long_*>_> local_78;
  _Vector_base<long_*,_std::allocator<long_*>_> local_60;
  _Vector_base<long_*,_std::allocator<long_*>_> local_48;
  
  if ((mask & 1) != 0) {
    lVar1 = (long)input->months % 0xc;
    std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_48,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar2 = HasPartValue<long*>((vector<long_*,_true> *)&local_48,BEGIN_BIGINT);
    std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_48);
    if (plVar2 != (long *)0x0) {
      plVar2[idx] = (long)(input->months / 0xc);
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_60,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar2 = HasPartValue<long*>((vector<long_*,_true> *)&local_60,MONTH);
    std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_60);
    if (plVar2 != (long *)0x0) {
      plVar2[idx] = (long)(int)lVar1;
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_78,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar2 = HasPartValue<long*>((vector<long_*,_true> *)&local_78,DAY);
    std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_78);
    if (plVar2 != (long *)0x0) {
      plVar2[idx] = (long)input->days;
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_90,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar2 = HasPartValue<long*>((vector<long_*,_true> *)&local_90,DECADE);
    std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_90);
    if (plVar2 != (long *)0x0) {
      plVar2[idx] = (long)(input->months / 0x78);
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_a8,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar2 = HasPartValue<long*>((vector<long_*,_true> *)&local_a8,CENTURY);
    std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_a8);
    if (plVar2 != (long *)0x0) {
      plVar2[idx] = (long)(input->months / 0x4b0);
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_c0,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar2 = HasPartValue<long*>((vector<long_*,_true> *)&local_c0,MILLENNIUM);
    std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_c0);
    if (plVar2 != (long *)0x0) {
      plVar2[idx] = (long)(input->months / 12000);
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_d8,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar2 = HasPartValue<long*>((vector<long_*,_true> *)&local_d8,QUARTER);
    std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_d8);
    if (plVar2 != (long *)0x0) {
      plVar2[idx] = (long)(char)((char)lVar1 / '\x03' + '\x01');
    }
  }
  if ((mask & 0x10) != 0) {
    uVar5 = input->micros % 60000000;
    std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_f0,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar2 = HasPartValue<long*>((vector<long_*,_true> *)&local_f0,MICROSECONDS);
    std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_f0);
    if (plVar2 != (long *)0x0) {
      plVar2[idx] = uVar5;
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_108,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar2 = HasPartValue<long*>((vector<long_*,_true> *)&local_108,MILLISECONDS);
    std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_108);
    uVar4 = (int)uVar5 >> 0x1f;
    if (plVar2 != (long *)0x0) {
      plVar2[idx] = (long)(int)((long)((ulong)uVar4 << 0x20 | uVar5 & 0xffffffff) / 1000);
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_120,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar2 = HasPartValue<long*>((vector<long_*,_true> *)&local_120,SECOND);
    std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_120);
    if (plVar2 != (long *)0x0) {
      plVar2[idx] = (long)(int)((long)((ulong)uVar4 << 0x20 | uVar5 & 0xffffffff) / 1000000);
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_138,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar2 = HasPartValue<long*>((vector<long_*,_true> *)&local_138,MINUTE);
    std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_138);
    if (plVar2 != (long *)0x0) {
      plVar2[idx] = (input->micros % 3600000000) / 60000000;
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_150,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar2 = HasPartValue<long*>((vector<long_*,_true> *)&local_150,HOUR);
    std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_150);
    if (plVar2 != (long *)0x0) {
      plVar2[idx] = input->micros / 3600000000;
    }
  }
  if ((mask & 8) != 0) {
    std::vector<double_*,_std::allocator<double_*>_>::vector
              ((vector<double_*,_std::allocator<double_*>_> *)&local_168,
               &double_values->super_vector<double_*,_std::allocator<double_*>_>);
    pdVar3 = HasPartValue<double*>((vector<double_*,_true> *)&local_168,BEGIN_DOUBLE);
    std::_Vector_base<double_*,_std::allocator<double_*>_>::~_Vector_base(&local_168);
    if (pdVar3 != (double *)0x0) {
      input_00.micros = extraout_RDX;
      input_00._0_8_ = input->micros;
      dVar6 = EpochOperator::Operation<duckdb::interval_t,double>(*(EpochOperator **)input,input_00)
      ;
      pdVar3[idx] = dVar6;
    }
  }
  return;
}

Assistant:

void DatePart::StructOperator::Operation(bigint_vec &bigint_values, double_vec &double_values, const interval_t &input,
                                         const idx_t idx, const part_mask_t mask) {
	int64_t *part_data;
	if (mask & YMD) {
		const auto mm = input.months % Interval::MONTHS_PER_YEAR;
		part_data = HasPartValue(bigint_values, DatePartSpecifier::YEAR);
		if (part_data) {
			part_data[idx] = input.months / Interval::MONTHS_PER_YEAR;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MONTH);
		if (part_data) {
			part_data[idx] = mm;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::DAY);
		if (part_data) {
			part_data[idx] = input.days;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::DECADE);
		if (part_data) {
			part_data[idx] = input.months / Interval::MONTHS_PER_DECADE;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::CENTURY);
		if (part_data) {
			part_data[idx] = input.months / Interval::MONTHS_PER_CENTURY;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MILLENNIUM);
		if (part_data) {
			part_data[idx] = input.months / Interval::MONTHS_PER_MILLENIUM;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::QUARTER);
		if (part_data) {
			part_data[idx] = mm / Interval::MONTHS_PER_QUARTER + 1;
		}
	}

	if (mask & TIME) {
		const auto micros = MicrosecondsOperator::Operation<interval_t, int64_t>(input);
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MICROSECONDS);
		if (part_data) {
			part_data[idx] = micros;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MILLISECONDS);
		if (part_data) {
			part_data[idx] = micros / Interval::MICROS_PER_MSEC;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::SECOND);
		if (part_data) {
			part_data[idx] = micros / Interval::MICROS_PER_SEC;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MINUTE);
		if (part_data) {
			part_data[idx] = MinutesOperator::Operation<interval_t, int64_t>(input);
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::HOUR);
		if (part_data) {
			part_data[idx] = HoursOperator::Operation<interval_t, int64_t>(input);
		}
	}

	if (mask & EPOCH) {
		auto part_data = HasPartValue(double_values, DatePartSpecifier::EPOCH);
		if (part_data) {
			part_data[idx] = EpochOperator::Operation<interval_t, double>(input);
		}
	}
}